

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestEventListener * __thiscall
testing::internal::TestEventRepeater::Release(TestEventRepeater *this,TestEventListener *listener)

{
  pointer ppTVar1;
  long lVar2;
  long lVar3;
  pointer ppTVar4;
  pointer __src;
  long lVar5;
  
  ppTVar1 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar4 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)ppTVar4 - (long)ppTVar1 != 0) {
    lVar2 = (long)ppTVar4 - (long)ppTVar1 >> 3;
    lVar3 = 0;
    lVar5 = 0;
    do {
      if (ppTVar1[lVar5] == listener) {
        __src = (pointer)((long)ppTVar1 + (lVar3 >> 0x1d) + 8);
        if (__src != ppTVar4) {
          memmove((void *)((long)ppTVar1 + (lVar3 >> 0x1d)),__src,(long)ppTVar4 - (long)__src);
          ppTVar4 = (this->listeners_).
                    super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        (this->listeners_).
        super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar4 + -1;
        return listener;
      }
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x100000000;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar5);
  }
  return (TestEventListener *)0x0;
}

Assistant:

TestEventListener* TestEventRepeater::Release(TestEventListener *listener) {
  for (size_t i = 0; i < listeners_.size(); ++i) {
    if (listeners_[i] == listener) {
      listeners_.erase(listeners_.begin() + static_cast<int>(i));
      return listener;
    }
  }

  return nullptr;
}